

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_parser.h
# Opt level: O2

uint64_t websocket_consume(void *buffer,uint64_t len,void *udata,uint8_t require_masking)

{
  fio_write_args_s options;
  void *target;
  uint64_t uVar1;
  long lVar2;
  char first;
  char text;
  uint64_t __n;
  byte *msg;
  byte *pbVar3;
  ws_s *ws;
  uchar in_stack_ffffffffffffff48;
  websocket_packet_info_s local_88;
  uint7 uStack_37;
  
  local_88 = websocket_buffer_peek(buffer,len);
  if (local_88.head_length == 0) {
    websocket_on_protocol_error(udata);
LAB_0014f40b:
    __n = 0;
  }
  else {
    __n = len;
    pbVar3 = (byte *)buffer;
    if (local_88.head_length + local_88.packet_length <= len) {
      while( true ) {
        if (__n < local_88.head_length + local_88.packet_length) break;
        msg = pbVar3 + local_88.head_length;
        if (local_88.masked == '\0') {
          if ((require_masking != '\0') && (local_88.packet_length != 0)) {
            websocket_on_protocol_error(udata);
          }
        }
        else {
          websocket_xmask(msg,local_88.packet_length,*(uint32_t *)(msg + -4));
        }
        switch(*pbVar3 & 0xf) {
        case 0:
          first = '\0';
          goto LAB_0014f2ce;
        case 1:
          first = '\x01';
          text = '\x01';
          goto LAB_0014f302;
        case 2:
          first = '\x01';
LAB_0014f2ce:
          text = '\0';
LAB_0014f302:
          websocket_on_unwrapped
                    (udata,msg,local_88.packet_length,first,*pbVar3 >> 7,text,
                     in_stack_ffffffffffffff48);
          break;
        default:
          websocket_on_protocol_error(udata);
          break;
        case 8:
          fio_close(*(intptr_t *)((long)udata + 0x30));
          break;
        case 9:
          target = malloc(local_88.packet_length + 0x10);
          if (*(char *)((long)udata + 0xb1) == '\0') {
            uVar1 = websocket_server_wrap
                              (target,msg,local_88.packet_length,'\n','\x01','\x01',
                               in_stack_ffffffffffffff48);
          }
          else {
            uVar1 = websocket_client_wrap
                              (target,msg,local_88.packet_length,'\n','\x01','\x01',
                               in_stack_ffffffffffffff48);
          }
          in_stack_ffffffffffffff48 = (uchar)target;
          options.after.dealloc = (_func_void_void_ptr *)0x0;
          options.data.buffer = target;
          options.length = uVar1;
          options.offset = 0;
          options._32_8_ = (ulong)uStack_37 << 8;
          fio_write2_fn(*(intptr_t *)((long)udata + 0x30),options);
          break;
        case 10:
        }
        __n = __n - (local_88.head_length + local_88.packet_length);
        if (__n == 0) goto LAB_0014f40b;
        lVar2 = local_88.head_length + local_88.packet_length;
        local_88 = websocket_buffer_peek(pbVar3 + lVar2,__n);
        pbVar3 = pbVar3 + lVar2;
      }
      memmove(buffer,(void *)((long)buffer + (len - __n)),__n);
    }
  }
  return __n;
}

Assistant:

static uint64_t websocket_consume(void *buffer, uint64_t len, void *udata,
                                  uint8_t require_masking) {
  volatile struct websocket_packet_info_s info =
      websocket_buffer_peek(buffer, len);
  if (!info.head_length) {
#if DEBUG
    fprintf(stderr, "ERROR: WebSocket protocol error - malicious header.\n");
#endif
    websocket_on_protocol_error(udata);
    return 0;
  }
  if (info.head_length + info.packet_length > len)
    return len;
  uint64_t reminder = len;
  uint8_t *pos = (uint8_t *)buffer;
  while (info.head_length + info.packet_length <= reminder) {
    /* parse head */
    void *payload = (void *)(pos + info.head_length);
    /* unmask? */
    if (info.masked) {
      /* masked */
      uint32_t mask; // = ((uint32_t *)payload)[-1];
      ((uint8_t *)(&mask))[0] = ((uint8_t *)(payload))[-4];
      ((uint8_t *)(&mask))[1] = ((uint8_t *)(payload))[-3];
      ((uint8_t *)(&mask))[2] = ((uint8_t *)(payload))[-2];
      ((uint8_t *)(&mask))[3] = ((uint8_t *)(payload))[-1];
      websocket_xmask(payload, info.packet_length, mask);
    } else if (require_masking && info.packet_length) {
#if DEBUG
      fprintf(stderr, "ERROR: WebSocket protocol error - unmasked data.\n");
#endif
      websocket_on_protocol_error(udata);
    }
    /* call callback */
    switch (pos[0] & 15) {
    case 0:
      /* continuation frame */
      websocket_on_unwrapped(udata, payload, info.packet_length, 0,
                             ((pos[0] >> 7) & 1), 0, ((pos[0] >> 4) & 7));
      break;
    case 1:
      /* text frame */
      websocket_on_unwrapped(udata, payload, info.packet_length, 1,
                             ((pos[0] >> 7) & 1), 1, ((pos[0] >> 4) & 7));
      break;
    case 2:
      /* data frame */
      websocket_on_unwrapped(udata, payload, info.packet_length, 1,
                             ((pos[0] >> 7) & 1), 0, ((pos[0] >> 4) & 7));
      break;
    case 8:
      /* close frame */
      websocket_on_protocol_close(udata);
      break;
    case 9:
      /* ping frame */
      websocket_on_protocol_ping(udata, payload, info.packet_length);
      break;
    case 10:
      /* pong frame */
      websocket_on_protocol_pong(udata, payload, info.packet_length);
      break;
    default:
#if DEBUG
      fprintf(stderr, "ERROR: WebSocket protocol error - unknown opcode %u\n",
              (unsigned int)(pos[0] & 15));
#endif
      websocket_on_protocol_error(udata);
    }
    /* step forward */
    reminder = reminder - (info.head_length + info.packet_length);
    if (!reminder)
      return 0;
    pos += info.head_length + info.packet_length;
    info = websocket_buffer_peek(pos, reminder);
  }
  /* reset buffer state - support pipelining */
  memmove(buffer, (uint8_t *)buffer + len - reminder, reminder);
  return reminder;
}